

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decallib.cpp
# Opt level: O3

void __thiscall FDecalLib::AddDecal(FDecalLib *this,FDecalBase *decal)

{
  WORD num;
  char *__s1;
  PClass **ppPVar1;
  NameEntry *pNVar2;
  uint uVar3;
  uint uVar4;
  ulong uVar5;
  FDecalBase *pFVar6;
  ulong uVar7;
  FDecalLib *pFVar8;
  FDecalBase *pFVar9;
  FDecalBase *from;
  
  pFVar6 = this->Root;
  num = decal->SpawnID;
  decal->SpawnID = 0;
  pNVar2 = FName::NameData.NameArray;
  pFVar8 = this;
  if (pFVar6 == (FDecalBase *)0x0) {
LAB_00376b24:
    pFVar8->Root = decal;
    decal->Left = (FDecalBase *)0x0;
    decal->Right = (FDecalBase *)0x0;
  }
  else {
    __s1 = FName::NameData.NameArray[(decal->Name).Index].Text;
    uVar3 = strcasecmp(__s1,FName::NameData.NameArray[(pFVar6->Name).Index].Text);
    from = pFVar6;
    if (uVar3 != 0) {
      do {
        pFVar9 = from;
        uVar4 = ~uVar3 >> 0x1f;
        from = (&pFVar9->Left)[uVar4];
        if (from == (FDecalBase *)0x0) {
          pFVar8 = (FDecalLib *)(&pFVar9->Left + uVar4);
          goto LAB_00376b24;
        }
        uVar3 = strcasecmp(__s1,pNVar2[(from->Name).Index].Text);
      } while (uVar3 != 0);
      pFVar8 = (FDecalLib *)(&pFVar9->Left + uVar4);
    }
    ReplaceDecalRef(from,decal,pFVar6);
    pFVar6 = from->Right;
    decal->Left = from->Left;
    decal->Right = pFVar6;
    pFVar8->Root = decal;
    uVar5 = (ulong)(from->Users).Count;
    if (uVar5 != 0) {
      ppPVar1 = (from->Users).Array;
      uVar7 = 0;
      do {
        *(FDecalBase **)(ppPVar1[uVar7]->Defaults + 0x478) = decal;
        uVar7 = uVar7 + 1;
      } while (uVar5 != uVar7);
    }
    TArray<const_PClass_*,_const_PClass_*>::operator=(&decal->Users,&from->Users);
    (*from->_vptr_FDecalBase[3])(from);
  }
  if (num != 0) {
    pFVar6 = ScanTreeForNum(num,this->Root);
    if (pFVar6 != (FDecalBase *)0x0) {
      pFVar6->SpawnID = 0;
    }
    decal->SpawnID = num;
  }
  return;
}

Assistant:

void FDecalLib::AddDecal (FDecalBase *decal)
{
	FDecalBase *node = Root, **prev = &Root;
	int num = decal->SpawnID;

	decal->SpawnID = 0;

	// Check if this decal already exists.
	while (node != NULL)
	{
		int lexx = stricmp (decal->Name, node->Name);
		if (lexx == 0)
		{
			break;
		}
		else if (lexx < 0)
		{
			prev = &node->Left;
			node = node->Left;
		}
		else
		{
			prev = &node->Right;
			node = node->Right;
		}
	}
	if (node == NULL)
	{ // No, add it.
		decal->SpawnID = 0;
		*prev = decal;
		decal->Left = NULL;
		decal->Right = NULL;
	}
	else
	{ // Yes, replace the old one.
		// If this decal has been used as the lowerdecal for another decal,
		// be sure and update the lowerdecal to use the new decal.
		ReplaceDecalRef(node, decal, Root);

		decal->Left = node->Left;
		decal->Right = node->Right;
		*prev = decal;

		// Fix references to the old decal so that they use the new one instead.
		for (unsigned int i = 0; i < node->Users.Size(); ++i)
		{
			((AActor *)node->Users[i]->Defaults)->DecalGenerator = decal;
		}
		decal->Users = node->Users;
		delete node;
	}
	// If this decal has an ID, make sure no existing decals have the same ID.
	if (num != 0)
	{
		FDecalBase *spawner = ScanTreeForNum (num, Root);
		if (spawner != NULL)
		{
			spawner->SpawnID = 0;
		}
		decal->SpawnID = num;
	}
}